

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaPrecision.cpp
# Opt level: O3

void __thiscall
glcts::GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)1>::deinit
          (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)1> *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0x40))(0x8c8e,0);
  (**(code **)(lVar2 + 0x78))(0x8d40,0);
  (**(code **)(lVar2 + 0xd8))(0);
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  if (this->m_vbo_a_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vbo_a_id);
    this->m_vbo_a_id = 0;
  }
  if (this->m_vbo_b_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vbo_b_id);
    this->m_vbo_b_id = 0;
  }
  if (this->m_vbo_c_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vbo_c_id);
    this->m_vbo_c_id = 0;
  }
  if (this->m_vbo_result_fma_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vbo_result_fma_id);
    this->m_vbo_result_fma_id = 0;
  }
  if (this->m_vbo_result_std_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vbo_result_std_id);
    this->m_vbo_result_std_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void					  GPUShader5FmaPrecision<S>::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	if (m_vbo_a_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_a_id);

		m_vbo_a_id = 0;
	}

	if (m_vbo_b_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_b_id);

		m_vbo_b_id = 0;
	}

	if (m_vbo_c_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_c_id);

		m_vbo_c_id = 0;
	}

	if (m_vbo_result_fma_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_result_fma_id);

		m_vbo_result_fma_id = 0;
	}

	if (m_vbo_result_std_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_result_std_id);

		m_vbo_result_std_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Call base class' deinit() */
	TestCaseBase::deinit();
}